

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::WatchUnusedCli(cmake *this,string *var)

{
  bool bVar1;
  pointer this_00;
  mapped_type_conflict1 *pmVar2;
  string *var_local;
  cmake *this_local;
  
  this_00 = std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::operator->
                      (&this->VariableWatch);
  cmVariableWatch::AddWatch(this_00,var,cmWarnUnusedCliWarning,this,(DeleteData)0x0);
  bVar1 = ::cm::
          contains<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&this->UsedCliVariables,var);
  if (!bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->UsedCliVariables,var);
    *pmVar2 = false;
  }
  return;
}

Assistant:

void cmake::WatchUnusedCli(const std::string& var)
{
#ifndef CMAKE_BOOTSTRAP
  this->VariableWatch->AddWatch(var, cmWarnUnusedCliWarning, this);
  if (!cm::contains(this->UsedCliVariables, var)) {
    this->UsedCliVariables[var] = false;
  }
#endif
}